

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_wallmarks::save(xr_scene_wallmarks *this,xr_writer *w)

{
  pointer ppwVar1;
  pointer ppwVar2;
  uint32_t id;
  write_slot local_3d;
  float local_3c;
  float local_38;
  float local_34;
  
  xr_scene_revision::save(&(this->super_xr_scene_part).m_revision,w);
  xr_writer::w_raw_chunk(w,1,&WALLMARK_VERSION,2,false);
  xr_writer::w_raw_chunk(w,2,&this->m_flags,4,false);
  xr_writer::open_chunk(w,3);
  local_3c = this->m_width;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_38 = this->m_height;
  (*w->_vptr_xr_writer[2])(w,&local_38,4);
  local_34 = this->m_rotate;
  (*w->_vptr_xr_writer[2])(w,&local_34,4);
  xr_writer::w_sz(w,&this->m_shader);
  xr_writer::w_sz(w,&this->m_texture);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,5);
  ppwVar2 = (this->m_slots).
            super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppwVar1 = (this->m_slots).
            super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppwVar2 != ppwVar1) {
    id = 0;
    do {
      xr_writer::open_chunk(w,id);
      write_slot::operator()(&local_3d,*ppwVar2,w);
      xr_writer::close_chunk(w);
      ppwVar2 = ppwVar2 + 1;
      id = id + 1;
    } while (ppwVar2 != ppwVar1);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_wallmarks::save(xr_writer& w) const
{
	revision().save(w);

	w.w_chunk<uint16_t>(WM_CHUNK_VERSION, WALLMARK_VERSION);
	w.w_chunk<uint32_t>(WM_CHUNK_FLAGS, m_flags);

	w.open_chunk(WM_CHUNK_PARAMS);
	w.w_float(m_width);
	w.w_float(m_height);
	w.w_float(m_rotate);
	w.w_sz(m_shader);
	w.w_sz(m_texture);
	w.close_chunk();

	w.open_chunk(WM_CHUNK_WALLMARKS_1);
	w.w_chunks(m_slots, write_slot());
	w.close_chunk();
}